

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Hacl_HPKE_Curve51_CP32_SHA256.c
# Opt level: O1

uint32_t Hacl_HPKE_Curve51_CP32_SHA256_setupBaseR
                   (Hacl_Impl_HPKE_context_s o_ctx,uint8_t *enc,uint8_t *skR,uint32_t infolen,
                   uint8_t *info)

{
  uint8_t *prk;
  undefined8 uVar1;
  undefined8 uVar2;
  undefined8 uVar3;
  byte bVar4;
  uint8_t *puVar5;
  uint32_t i;
  long lVar6;
  ulong uVar7;
  byte bVar8;
  uint ikmlen;
  undefined8 uStack_320;
  uint8_t auStack_318 [6];
  undefined2 uStack_312;
  undefined1 auStack_310 [8];
  undefined1 auStack_308 [8];
  undefined8 uStack_300;
  undefined8 uStack_2f8;
  undefined8 uStack_2f0;
  undefined8 uStack_2e8;
  undefined8 uStack_2e0;
  undefined1 auStack_2d8 [8];
  undefined1 auStack_2d0 [14];
  undefined1 auStack_2c2 [10];
  uint8_t auStack_2b8 [6];
  undefined2 uStack_2b2;
  undefined1 auStack_2b0 [8];
  undefined8 uStack_2a8;
  undefined8 uStack_2a0;
  undefined8 uStack_298;
  undefined8 uStack_290;
  undefined8 uStack_288;
  undefined1 auStack_280 [8];
  undefined1 auStack_278 [8];
  undefined1 auStack_270 [16];
  undefined8 uStack_260;
  uint8_t local_258 [8];
  undefined1 auStack_250 [5];
  uint8_t uStack_24b;
  undefined2 uStack_24a;
  undefined1 auStack_248 [3];
  undefined1 auStack_245 [4];
  uint8_t uStack_241;
  undefined8 uStack_240;
  undefined3 local_238;
  undefined1 auStack_235 [5];
  undefined3 uStack_230;
  undefined1 auStack_22d [5];
  undefined3 local_228;
  undefined1 auStack_225 [5];
  undefined3 uStack_220;
  undefined1 auStack_21d [5];
  undefined3 uStack_218;
  undefined1 auStack_215 [5];
  undefined3 uStack_210;
  undefined1 local_20d [5];
  undefined3 uStack_208;
  undefined5 uStack_205;
  undefined3 uStack_200;
  undefined5 uStack_1fd;
  uint8_t local_1f8 [4];
  undefined2 uStack_1f4;
  undefined1 uStack_1f2;
  undefined1 auStack_1f1 [4];
  undefined4 uStack_1ed;
  uint8_t auStack_1e9 [2];
  undefined1 auStack_1e7 [4];
  undefined2 uStack_1e3;
  undefined3 uStack_1e0;
  undefined5 uStack_1dd;
  undefined4 local_1d8;
  undefined2 uStack_1d4;
  uint8_t uStack_1d2;
  undefined4 uStack_1d1;
  undefined4 uStack_1cd;
  uint8_t auStack_1c9 [2];
  undefined2 uStack_1c7;
  undefined1 uStack_1c5;
  undefined4 uStack_1c4;
  undefined4 uStack_1c0;
  undefined4 uStack_1bc;
  uint8_t auStack_1b8 [8];
  uint8_t pkR [32];
  uint8_t o_secret [32];
  uint8_t o_psk_id_hash [32];
  uint8_t o_info_hash [32];
  uint8_t kemcontext [64];
  uint8_t zeros [32];
  uint8_t o_eae_prk [32];
  uint8_t shared [32];
  uint8_t dh [32];
  uint8_t suite_id_kem [5];
  undefined8 local_40;
  uint8_t suite_id [10];
  
  pkR[8] = '\0';
  pkR[9] = '\0';
  pkR[10] = '\0';
  pkR[0xb] = '\0';
  pkR[0xc] = '\0';
  pkR[0xd] = '\0';
  pkR[0xe] = '\0';
  pkR[0xf] = '\0';
  pkR[0x10] = '\0';
  pkR[0x11] = '\0';
  pkR[0x12] = '\0';
  pkR[0x13] = '\0';
  pkR[0x14] = '\0';
  pkR[0x15] = '\0';
  pkR[0x16] = '\0';
  pkR[0x17] = '\0';
  auStack_1b8[0] = '\0';
  auStack_1b8[1] = '\0';
  auStack_1b8[2] = '\0';
  auStack_1b8[3] = '\0';
  auStack_1b8[4] = '\0';
  auStack_1b8[5] = '\0';
  auStack_1b8[6] = '\0';
  auStack_1b8[7] = '\0';
  pkR[0] = '\0';
  pkR[1] = '\0';
  pkR[2] = '\0';
  pkR[3] = '\0';
  pkR[4] = '\0';
  pkR[5] = '\0';
  pkR[6] = '\0';
  pkR[7] = '\0';
  uStack_1c0 = 0x16b607;
  uStack_1bc = 0;
  Hacl_Curve25519_51_secret_to_public(auStack_1b8,skR);
  shared[8] = '\0';
  shared[9] = '\0';
  shared[10] = '\0';
  shared[0xb] = '\0';
  shared[0xc] = '\0';
  shared[0xd] = '\0';
  shared[0xe] = '\0';
  shared[0xf] = '\0';
  shared[0x10] = '\0';
  shared[0x11] = '\0';
  shared[0x12] = '\0';
  shared[0x13] = '\0';
  shared[0x14] = '\0';
  shared[0x15] = '\0';
  shared[0x16] = '\0';
  shared[0x17] = '\0';
  o_eae_prk[0x18] = '\0';
  o_eae_prk[0x19] = '\0';
  o_eae_prk[0x1a] = '\0';
  o_eae_prk[0x1b] = '\0';
  o_eae_prk[0x1c] = '\0';
  o_eae_prk[0x1d] = '\0';
  o_eae_prk[0x1e] = '\0';
  o_eae_prk[0x1f] = '\0';
  shared[0] = '\0';
  shared[1] = '\0';
  shared[2] = '\0';
  shared[3] = '\0';
  shared[4] = '\0';
  shared[5] = '\0';
  shared[6] = '\0';
  shared[7] = '\0';
  dh[8] = '\0';
  dh[9] = '\0';
  dh[10] = '\0';
  dh[0xb] = '\0';
  dh[0xc] = '\0';
  dh[0xd] = '\0';
  dh[0xe] = '\0';
  dh[0xf] = '\0';
  dh[0x10] = '\0';
  dh[0x11] = '\0';
  dh[0x12] = '\0';
  dh[0x13] = '\0';
  dh[0x14] = '\0';
  dh[0x15] = '\0';
  dh[0x16] = '\0';
  dh[0x17] = '\0';
  shared[0x18] = '\0';
  shared[0x19] = '\0';
  shared[0x1a] = '\0';
  shared[0x1b] = '\0';
  shared[0x1c] = '\0';
  shared[0x1d] = '\0';
  shared[0x1e] = '\0';
  shared[0x1f] = '\0';
  dh[0] = '\0';
  dh[1] = '\0';
  dh[2] = '\0';
  dh[3] = '\0';
  dh[4] = '\0';
  dh[5] = '\0';
  dh[6] = '\0';
  dh[7] = '\0';
  zeros[8] = '\0';
  zeros[9] = '\0';
  zeros[10] = '\0';
  zeros[0xb] = '\0';
  zeros[0xc] = '\0';
  zeros[0xd] = '\0';
  zeros[0xe] = '\0';
  zeros[0xf] = '\0';
  zeros[0x10] = '\0';
  zeros[0x11] = '\0';
  zeros[0x12] = '\0';
  zeros[0x13] = '\0';
  zeros[0x14] = '\0';
  zeros[0x15] = '\0';
  zeros[0x16] = '\0';
  zeros[0x17] = '\0';
  kemcontext[0x38] = '\0';
  kemcontext[0x39] = '\0';
  kemcontext[0x3a] = '\0';
  kemcontext[0x3b] = '\0';
  kemcontext[0x3c] = '\0';
  kemcontext[0x3d] = '\0';
  kemcontext[0x3e] = '\0';
  kemcontext[0x3f] = '\0';
  zeros[0] = '\0';
  zeros[1] = '\0';
  zeros[2] = '\0';
  zeros[3] = '\0';
  zeros[4] = '\0';
  zeros[5] = '\0';
  zeros[6] = '\0';
  zeros[7] = '\0';
  uStack_1c0 = 0x16b63f;
  uStack_1bc = 0;
  Hacl_Curve25519_51_scalarmult(shared + 0x18,skR,enc);
  bVar8 = 0xff;
  lVar6 = 0;
  do {
    uStack_1c0 = 0x16b65c;
    uStack_1bc = 0;
    bVar4 = FStar_UInt8_eq_mask(shared[lVar6 + 0x18],kemcontext[lVar6 + 0x38]);
    bVar8 = bVar8 & bVar4;
    lVar6 = lVar6 + 1;
  } while (lVar6 != 0x20);
  kemcontext[0x28] = '\0';
  kemcontext[0x29] = '\0';
  kemcontext[0x2a] = '\0';
  kemcontext[0x2b] = '\0';
  kemcontext[0x2c] = '\0';
  kemcontext[0x2d] = '\0';
  kemcontext[0x2e] = '\0';
  kemcontext[0x2f] = '\0';
  kemcontext[0x30] = '\0';
  kemcontext[0x31] = '\0';
  kemcontext[0x32] = '\0';
  kemcontext[0x33] = '\0';
  kemcontext[0x34] = '\0';
  kemcontext[0x35] = '\0';
  kemcontext[0x36] = '\0';
  kemcontext[0x37] = '\0';
  kemcontext[0x18] = '\0';
  kemcontext[0x19] = '\0';
  kemcontext[0x1a] = '\0';
  kemcontext[0x1b] = '\0';
  kemcontext[0x1c] = '\0';
  kemcontext[0x1d] = '\0';
  kemcontext[0x1e] = '\0';
  kemcontext[0x1f] = '\0';
  kemcontext[0x20] = '\0';
  kemcontext[0x21] = '\0';
  kemcontext[0x22] = '\0';
  kemcontext[0x23] = '\0';
  kemcontext[0x24] = '\0';
  kemcontext[0x25] = '\0';
  kemcontext[0x26] = '\0';
  kemcontext[0x27] = '\0';
  kemcontext[8] = '\0';
  kemcontext[9] = '\0';
  kemcontext[10] = '\0';
  kemcontext[0xb] = '\0';
  kemcontext[0xc] = '\0';
  kemcontext[0xd] = '\0';
  kemcontext[0xe] = '\0';
  kemcontext[0xf] = '\0';
  kemcontext[0x10] = '\0';
  kemcontext[0x11] = '\0';
  kemcontext[0x12] = '\0';
  kemcontext[0x13] = '\0';
  kemcontext[0x14] = '\0';
  kemcontext[0x15] = '\0';
  kemcontext[0x16] = '\0';
  kemcontext[0x17] = '\0';
  kemcontext[0] = '\0';
  kemcontext[1] = '\0';
  kemcontext[2] = '\0';
  kemcontext[3] = '\0';
  kemcontext[4] = '\0';
  kemcontext[5] = '\0';
  kemcontext[6] = '\0';
  kemcontext[7] = '\0';
  if (bVar8 != 0xff) {
    uStack_1c0 = 0x16b6a3;
    uStack_1bc = 0;
    Hacl_Curve25519_51_secret_to_public(kemcontext + 0x18,skR);
    uVar1 = *(undefined8 *)enc;
    kemcontext._0_8_ = *(undefined8 *)(enc + 8);
    kemcontext._8_8_ = *(undefined8 *)(enc + 0x10);
    kemcontext._16_8_ = *(undefined8 *)(enc + 0x18);
    o_eae_prk[8] = '\0';
    o_eae_prk[9] = '\0';
    o_eae_prk[10] = '\0';
    o_eae_prk[0xb] = '\0';
    o_eae_prk[0xc] = '\0';
    o_eae_prk[0xd] = '\0';
    o_eae_prk[0xe] = '\0';
    o_eae_prk[0xf] = '\0';
    o_eae_prk[0x10] = '\0';
    o_eae_prk[0x11] = '\0';
    o_eae_prk[0x12] = '\0';
    o_eae_prk[0x13] = '\0';
    o_eae_prk[0x14] = '\0';
    o_eae_prk[0x15] = '\0';
    o_eae_prk[0x16] = '\0';
    o_eae_prk[0x17] = '\0';
    zeros[0x18] = '\0';
    zeros[0x19] = '\0';
    zeros[0x1a] = '\0';
    zeros[0x1b] = '\0';
    zeros[0x1c] = '\0';
    zeros[0x1d] = '\0';
    zeros[0x1e] = '\0';
    zeros[0x1f] = '\0';
    o_eae_prk[0] = '\0';
    o_eae_prk[1] = '\0';
    o_eae_prk[2] = '\0';
    o_eae_prk[3] = '\0';
    o_eae_prk[4] = '\0';
    o_eae_prk[5] = '\0';
    o_eae_prk[6] = '\0';
    o_eae_prk[7] = '\0';
    builtin_memcpy(dh + 0x18,"KEM",4);
    dh[0x1c] = ' ';
    builtin_memcpy(local_1f8,"HPKE",4);
    uStack_1f4 = 0x762d;
    uStack_1f2 = 0x31;
    auStack_1f1 = (undefined1  [4])0x4d454b;
    uStack_1ed = 0x65616520;
    _auStack_1e9 = 0x6b72705f;
    stack0xfffffffffffffe1b = (undefined5)shared._24_8_;
    uStack_1e0 = SUB83(shared._24_8_,5);
    uStack_1dd = (undefined5)dh._0_8_;
    local_1d8._0_3_ = SUB83(dh._0_8_,5);
    local_1d8._3_1_ = (uint8_t)dh._8_8_;
    uStack_1d4 = SUB82(dh._8_8_,1);
    uStack_1d2 = SUB81(dh._8_8_,3);
    uStack_1d1 = SUB84(dh._8_8_,4);
    uStack_1cd = (undefined4)dh._16_8_;
    auStack_1c9[0] = SUB81(dh._16_8_,4);
    auStack_1c9[1] = SUB81(dh._16_8_,5);
    uStack_1c7 = SUB82(dh._16_8_,6);
    uStack_200 = 0x16b74e;
    uStack_1fd = 0;
    Hacl_HKDF_extract_sha2_256(zeros + 0x18,dh + 0x18,0,local_1f8,0x33);
    uVar2 = dh._24_8_;
    local_258[0] = '\0';
    local_258[1] = ' ';
    local_258[2] = 'H';
    local_258[3] = 'P';
    local_258[4] = 'K';
    local_258[5] = 'E';
    local_258[6] = '-';
    local_258[7] = 'v';
    auStack_250[0] = 0x31;
    auStack_250[1] = dh[0x18];
    auStack_250[2] = dh[0x19];
    auStack_250[3] = dh[0x1a];
    auStack_250[4] = dh[0x1b];
    dh[0x1c] = SUB81(uVar2,4);
    uStack_24b = dh[0x1c];
    uStack_24a = 0x6873;
    auStack_248 = (undefined1  [3])0x657261;
    auStack_245._0_3_ = 0x735f64;
    stack0xfffffffffffffdbe = 0x6365;
    uStack_240._0_3_ = 0x746572;
    uStack_240._3_5_ = (undefined5)uVar1;
    local_238 = (undefined3)((ulong)uVar1 >> 0x28);
    auStack_235 = SUB85(kemcontext._0_8_,0);
    uStack_230 = SUB83(kemcontext._0_8_,5);
    auStack_22d = SUB85(kemcontext._8_8_,0);
    local_228 = SUB83(kemcontext._8_8_,5);
    auStack_225 = SUB85(kemcontext._16_8_,0);
    uStack_220 = SUB83(kemcontext._16_8_,5);
    auStack_21d = SUB85(kemcontext._24_8_,0);
    uStack_218 = SUB83(kemcontext._24_8_,5);
    auStack_215 = SUB85(kemcontext._32_8_,0);
    uStack_210 = SUB83(kemcontext._32_8_,5);
    local_20d = SUB85(kemcontext._40_8_,0);
    uStack_208 = SUB83(kemcontext._40_8_,5);
    uStack_205 = (undefined5)kemcontext._48_8_;
    uStack_200 = SUB83(kemcontext._48_8_,5);
    uStack_260 = 0x16b7fd;
    dh._24_8_ = uVar2;
    Hacl_HKDF_expand_sha2_256(o_eae_prk + 0x18,zeros + 0x18,0x20,local_258,0x5b,0x20);
    o_secret[8] = '\0';
    o_secret[9] = '\0';
    o_secret[10] = '\0';
    o_secret[0xb] = '\0';
    o_secret[0xc] = '\0';
    o_secret[0xd] = '\0';
    o_secret[0xe] = '\0';
    o_secret[0xf] = '\0';
    o_secret[0x10] = '\0';
    o_secret[0x11] = '\0';
    o_secret[0x12] = '\0';
    o_secret[0x13] = '\0';
    o_secret[0x14] = '\0';
    o_secret[0x15] = '\0';
    o_secret[0x16] = '\0';
    o_secret[0x17] = '\0';
    pkR[0x18] = '\0';
    pkR[0x19] = '\0';
    pkR[0x1a] = '\0';
    pkR[0x1b] = '\0';
    pkR[0x1c] = '\0';
    pkR[0x1d] = '\0';
    pkR[0x1e] = '\0';
    pkR[0x1f] = '\0';
    o_secret[0] = '\0';
    o_secret[1] = '\0';
    o_secret[2] = '\0';
    o_secret[3] = '\0';
    o_secret[4] = '\0';
    o_secret[5] = '\0';
    o_secret[6] = '\0';
    o_secret[7] = '\0';
    local_40 = 0x1002000454b5048;
    suite_id[0] = '\0';
    suite_id[1] = '\x03';
    o_psk_id_hash[8] = '\0';
    o_psk_id_hash[9] = '\0';
    o_psk_id_hash[10] = '\0';
    o_psk_id_hash[0xb] = '\0';
    o_psk_id_hash[0xc] = '\0';
    o_psk_id_hash[0xd] = '\0';
    o_psk_id_hash[0xe] = '\0';
    o_psk_id_hash[0xf] = '\0';
    o_psk_id_hash[0x10] = '\0';
    o_psk_id_hash[0x11] = '\0';
    o_psk_id_hash[0x12] = '\0';
    o_psk_id_hash[0x13] = '\0';
    o_psk_id_hash[0x14] = '\0';
    o_psk_id_hash[0x15] = '\0';
    o_psk_id_hash[0x16] = '\0';
    o_psk_id_hash[0x17] = '\0';
    o_secret[0x18] = '\0';
    o_secret[0x19] = '\0';
    o_secret[0x1a] = '\0';
    o_secret[0x1b] = '\0';
    o_secret[0x1c] = '\0';
    o_secret[0x1d] = '\0';
    o_secret[0x1e] = '\0';
    o_secret[0x1f] = '\0';
    o_psk_id_hash[0] = '\0';
    o_psk_id_hash[1] = '\0';
    o_psk_id_hash[2] = '\0';
    o_psk_id_hash[3] = '\0';
    o_psk_id_hash[4] = '\0';
    o_psk_id_hash[5] = '\0';
    o_psk_id_hash[6] = '\0';
    o_psk_id_hash[7] = '\0';
    local_1d8 = 0x454b5048;
    uStack_1d4 = 0x762d;
    uStack_1d2 = '1';
    uStack_1d1 = 0x454b5048;
    uStack_1cd = 0x1002000;
    auStack_1c9[0] = '\0';
    auStack_1c9[1] = 3;
    uStack_1c7 = 0x7370;
    uStack_1c5 = 0x6b;
    uStack_1c4 = 0x5f64695f;
    uStack_1c0 = 0x68736168;
    uStack_1e0 = 0x16b897;
    uStack_1dd = 0;
    Hacl_HKDF_extract_sha2_256(o_secret + 0x18,(uint8_t *)&local_40,0,(uint8_t *)&local_1d8,0x1c);
    o_psk_id_hash[0x18] = '\0';
    o_psk_id_hash[0x19] = '\0';
    o_psk_id_hash[0x1a] = '\0';
    o_psk_id_hash[0x1b] = '\0';
    o_psk_id_hash[0x1c] = '\0';
    o_psk_id_hash[0x1d] = '\0';
    o_psk_id_hash[0x1e] = '\0';
    o_psk_id_hash[0x1f] = '\0';
    ikmlen = infolen + 0x1a;
    uVar7 = (ulong)ikmlen + 0xf & 0xfffffffffffffff0;
    lVar6 = -uVar7;
    puVar5 = (uint8_t *)((long)&local_1d8 + lVar6);
    *(undefined8 *)((long)&uStack_1e0 + lVar6) = 0x16b8d1;
    memset(puVar5,0,(ulong)ikmlen);
    builtin_memcpy((uint8_t *)((long)&local_1d8 + lVar6),"HPKE",4);
    *(undefined2 *)((long)&uStack_1d4 + lVar6) = 0x762d;
    (&uStack_1d2)[lVar6] = '1';
    *(undefined8 *)((long)&uStack_1d1 + lVar6) = local_40;
    *(undefined2 *)(auStack_1c9 + lVar6) = suite_id._0_2_;
    *(undefined8 *)((long)&uStack_1c7 + lVar6) = 0x7361685f6f666e69;
    *(undefined1 *)((long)&uStack_1c0 + (1 - uVar7)) = 0x68;
    *(undefined8 *)((long)&uStack_1e0 + lVar6) = 0x16b91f;
    memcpy((void *)((long)&uStack_1c0 + lVar6 + 2),info,(ulong)infolen);
    *(undefined8 *)((long)&uStack_1e0 + lVar6) = 0x16b93d;
    Hacl_HKDF_extract_sha2_256(o_psk_id_hash + 0x18,(uint8_t *)&local_40,0,puVar5,ikmlen);
    o_eae_prk[8] = o_psk_id_hash[8];
    o_eae_prk[9] = o_psk_id_hash[9];
    o_eae_prk[10] = o_psk_id_hash[10];
    o_eae_prk[0xb] = o_psk_id_hash[0xb];
    o_eae_prk[0xc] = o_psk_id_hash[0xc];
    o_eae_prk[0xd] = o_psk_id_hash[0xd];
    o_eae_prk[0xe] = o_psk_id_hash[0xe];
    o_eae_prk[0xf] = o_psk_id_hash[0xf];
    o_eae_prk[0x10] = o_psk_id_hash[0x10];
    o_eae_prk[0x11] = o_psk_id_hash[0x11];
    o_eae_prk[0x12] = o_psk_id_hash[0x12];
    o_eae_prk[0x13] = o_psk_id_hash[0x13];
    o_eae_prk[0x14] = o_psk_id_hash[0x14];
    o_eae_prk[0x15] = o_psk_id_hash[0x15];
    o_eae_prk[0x16] = o_psk_id_hash[0x16];
    o_eae_prk[0x17] = o_psk_id_hash[0x17];
    zeros[0x18] = o_secret[0x18];
    zeros[0x19] = o_secret[0x19];
    zeros[0x1a] = o_secret[0x1a];
    zeros[0x1b] = o_secret[0x1b];
    zeros[0x1c] = o_secret[0x1c];
    zeros[0x1d] = o_secret[0x1d];
    zeros[0x1e] = o_secret[0x1e];
    zeros[0x1f] = o_secret[0x1f];
    o_eae_prk[0] = o_psk_id_hash[0];
    o_eae_prk[1] = o_psk_id_hash[1];
    o_eae_prk[2] = o_psk_id_hash[2];
    o_eae_prk[3] = o_psk_id_hash[3];
    o_eae_prk[4] = o_psk_id_hash[4];
    o_eae_prk[5] = o_psk_id_hash[5];
    o_eae_prk[6] = o_psk_id_hash[6];
    o_eae_prk[7] = o_psk_id_hash[7];
    dh[0x18] = o_psk_id_hash[0x18];
    dh[0x19] = o_psk_id_hash[0x19];
    dh[0x1a] = o_psk_id_hash[0x1a];
    dh[0x1b] = o_psk_id_hash[0x1b];
    dh[0x1c] = o_psk_id_hash[0x1c];
    dh[0x1d] = o_psk_id_hash[0x1d];
    dh[0x1e] = o_psk_id_hash[0x1e];
    dh[0x1f] = o_psk_id_hash[0x1f];
    puVar5 = local_1f8 + lVar6;
    puVar5[0] = '\0';
    puVar5[1] = '\0';
    puVar5[2] = '\0';
    puVar5[3] = '\0';
    puVar5[4] = '\0';
    puVar5[5] = '\0';
    puVar5[6] = '\0';
    puVar5[7] = '\0';
    *(undefined8 *)(auStack_1f1 + lVar6 + 1) = 0;
    puVar5 = auStack_1e9 + lVar6;
    puVar5[0] = '\0';
    puVar5[1] = '\0';
    puVar5[2] = '\0';
    puVar5[3] = '\0';
    puVar5[4] = '\0';
    puVar5[5] = '\0';
    puVar5[6] = '\0';
    puVar5[7] = '\0';
    builtin_memcpy(local_1f8 + lVar6,"HPKE",4);
    *(undefined2 *)((long)&uStack_1f4 + lVar6) = 0x762d;
    (&uStack_1f2)[lVar6] = 0x31;
    *(undefined8 *)(auStack_1f1 + lVar6) = local_40;
    *(undefined2 *)(auStack_1e9 + lVar6) = suite_id._0_2_;
    *(undefined4 *)(auStack_1e7 + lVar6) = 0x72636573;
    *(undefined2 *)((long)&uStack_1e3 + lVar6) = 0x7465;
    prk = pkR + 0x18;
    *(undefined8 *)((long)&uStack_200 + lVar6) = 0x16b9de;
    Hacl_HKDF_extract_sha2_256(prk,o_eae_prk + 0x18,0x20,local_1f8 + lVar6,0x17);
    puVar5 = local_258 + lVar6;
    puVar5[0] = '\0';
    puVar5[1] = '\0';
    puVar5[2] = '\0';
    puVar5[3] = '\0';
    puVar5[4] = '\0';
    puVar5[5] = '\0';
    puVar5[6] = '\0';
    puVar5[7] = '\0';
    *(undefined8 *)(auStack_250 + lVar6) = 0;
    *(undefined8 *)(local_20d + lVar6 + 4) = 0;
    *(undefined8 *)(auStack_215 + lVar6 + -3) = 0;
    *(undefined8 *)(local_20d + lVar6 + -3) = 0;
    *(undefined8 *)(auStack_225 + lVar6 + -3) = 0;
    *(undefined8 *)(auStack_21d + lVar6 + -3) = 0;
    *(undefined8 *)(auStack_235 + lVar6 + -3) = 0;
    *(undefined8 *)(auStack_22d + lVar6 + -3) = 0;
    *(undefined8 *)(auStack_248 + lVar6) = 0;
    *(undefined8 *)((long)&uStack_240 + lVar6) = 0;
    (local_258 + lVar6)[0] = '\0';
    (local_258 + lVar6)[1] = ' ';
    puVar5 = local_258 + lVar6 + 2;
    puVar5[0] = 'H';
    puVar5[1] = 'P';
    puVar5[2] = 'K';
    puVar5[3] = 'E';
    (local_258 + lVar6 + 6)[0] = '-';
    (local_258 + lVar6 + 6)[1] = 'v';
    auStack_250[lVar6] = 0x31;
    *(undefined8 *)(auStack_250 + lVar6 + 1) = local_40;
    *(undefined2 *)(auStack_248 + lVar6 + 1) = suite_id._0_2_;
    *(undefined4 *)(auStack_245 + lVar6) = 0x707865;
    uVar3 = o_eae_prk._16_8_;
    uVar2 = o_eae_prk._0_8_;
    uVar1 = zeros._24_8_;
    *(undefined8 *)(auStack_235 + lVar6 + 4) = o_eae_prk._8_8_;
    *(undefined8 *)(auStack_22d + lVar6 + 4) = uVar3;
    *(undefined8 *)(&uStack_241 + lVar6) = uVar1;
    *(undefined8 *)((long)&uStack_240 + lVar6 + 7) = uVar2;
    *(undefined8 *)(auStack_225 + lVar6 + 4) = dh._24_8_;
    *(undefined8 *)(auStack_21d + lVar6 + 4) = 0;
    *(undefined8 *)(auStack_215 + lVar6 + 4) = 0;
    *(undefined8 *)(local_20d + lVar6 + 4) = 0;
    *(undefined8 *)((long)&uStack_260 + lVar6) = 0x16ba84;
    Hacl_HKDF_expand_sha2_256(o_ctx.ctx_exporter,prk,0x20,local_258 + lVar6,0x57,0x20);
    puVar5 = auStack_2b8 + lVar6;
    puVar5[0] = '\0';
    puVar5[1] = '\0';
    puVar5[2] = '\0';
    puVar5[3] = '\0';
    puVar5[4] = '\0';
    puVar5[5] = '\0';
    puVar5[6] = '\0';
    puVar5[7] = '\0';
    *(undefined8 *)(auStack_2b0 + lVar6) = 0;
    *(undefined8 *)(auStack_270 + lVar6 + 7) = 0;
    *(undefined8 *)(auStack_278 + lVar6) = 0;
    *(undefined8 *)(auStack_270 + lVar6) = 0;
    *(undefined8 *)(auStack_280 + lVar6 + -8) = 0;
    *(undefined8 *)(auStack_280 + lVar6) = 0;
    *(undefined8 *)((long)&uStack_298 + lVar6) = 0;
    *(undefined8 *)((long)&uStack_290 + lVar6) = 0;
    *(undefined8 *)((long)&uStack_2a8 + lVar6) = 0;
    *(undefined8 *)((long)&uStack_2a0 + lVar6) = 0;
    (auStack_2b8 + lVar6)[0] = '\0';
    (auStack_2b8 + lVar6)[1] = ' ';
    puVar5 = auStack_2b8 + lVar6 + 2;
    puVar5[0] = 'H';
    puVar5[1] = 'P';
    puVar5[2] = 'K';
    puVar5[3] = 'E';
    *(undefined2 *)((long)&uStack_2b2 + lVar6) = 0x762d;
    auStack_2b0[lVar6] = 0x31;
    *(undefined8 *)(auStack_2b0 + lVar6 + 1) = local_40;
    *(undefined2 *)((long)&uStack_2a8 + lVar6 + 1) = suite_id._0_2_;
    *(undefined4 *)((long)&uStack_2a8 + lVar6 + 3) = 0x79656b;
    uVar3 = o_eae_prk._16_8_;
    uVar2 = o_eae_prk._0_8_;
    uVar1 = zeros._24_8_;
    *(undefined8 *)((long)&uStack_298 + lVar6 + 7) = o_eae_prk._8_8_;
    *(undefined8 *)((long)&uStack_290 + lVar6 + 7) = uVar3;
    *(undefined8 *)((long)&uStack_2a8 + lVar6 + 7) = uVar1;
    *(undefined8 *)((long)&uStack_2a0 + lVar6 + 7) = uVar2;
    *(undefined8 *)(auStack_280 + lVar6 + -1) = dh._24_8_;
    *(undefined8 *)(auStack_280 + lVar6 + 7) = 0;
    *(undefined8 *)(auStack_278 + lVar6 + 7) = 0;
    *(undefined8 *)(auStack_270 + lVar6 + 7) = 0;
    *(undefined8 *)(auStack_2c2 + lVar6 + 2) = 0x16bb21;
    Hacl_HKDF_expand_sha2_256(o_ctx.ctx_key,prk,0x20,auStack_2b8 + lVar6,0x57,0x20);
    puVar5 = auStack_318 + lVar6;
    puVar5[0] = '\0';
    puVar5[1] = '\0';
    puVar5[2] = '\0';
    puVar5[3] = '\0';
    puVar5[4] = '\0';
    puVar5[5] = '\0';
    puVar5[6] = '\0';
    puVar5[7] = '\0';
    *(undefined8 *)(auStack_310 + lVar6) = 0;
    *(undefined8 *)(auStack_2d0 + lVar6 + 6) = 0;
    *(undefined8 *)(auStack_2c2 + lVar6) = 0;
    *(undefined8 *)(auStack_2d8 + lVar6) = 0;
    *(undefined8 *)(auStack_2d0 + lVar6) = 0;
    *(undefined8 *)((long)&uStack_2e8 + lVar6) = 0;
    *(undefined8 *)(auStack_2d8 + lVar6 + -8) = 0;
    *(undefined8 *)((long)&uStack_2f8 + lVar6) = 0;
    *(undefined8 *)((long)&uStack_2f0 + lVar6) = 0;
    *(undefined8 *)(auStack_308 + lVar6) = 0;
    *(undefined8 *)((long)&uStack_300 + lVar6) = 0;
    (auStack_318 + lVar6)[0] = '\0';
    (auStack_318 + lVar6)[1] = '\f';
    puVar5 = auStack_318 + lVar6 + 2;
    puVar5[0] = 'H';
    puVar5[1] = 'P';
    puVar5[2] = 'K';
    puVar5[3] = 'E';
    *(undefined2 *)((long)&uStack_312 + lVar6) = 0x762d;
    auStack_310[lVar6] = 0x31;
    *(undefined8 *)(auStack_310 + lVar6 + 1) = local_40;
    *(undefined2 *)(auStack_308 + lVar6 + 1) = suite_id._0_2_;
    *(undefined8 *)(auStack_308 + lVar6 + 3) = 0x6e6f6e5f65736162;
    *(undefined2 *)((long)&uStack_300 + lVar6 + 3) = 0x6563;
    *(undefined1 *)((long)&uStack_300 + lVar6 + 5) = 0;
    uVar3 = o_eae_prk._16_8_;
    uVar2 = o_eae_prk._0_8_;
    uVar1 = zeros._24_8_;
    *(undefined8 *)((long)&uStack_2f0 + lVar6 + 6) = o_eae_prk._8_8_;
    *(undefined8 *)((long)&uStack_2e8 + lVar6 + 6) = uVar3;
    *(undefined8 *)((long)&uStack_300 + lVar6 + 6) = uVar1;
    *(undefined8 *)((long)&uStack_2f8 + lVar6 + 6) = uVar2;
    *(undefined8 *)(auStack_2d8 + lVar6 + -2) = dh._24_8_;
    *(undefined8 *)(auStack_2d8 + lVar6 + 6) = 0;
    *(undefined8 *)(auStack_2d0 + lVar6 + 6) = 0;
    *(undefined8 *)(auStack_2c2 + lVar6) = 0;
    *(undefined8 *)((long)&uStack_320 + lVar6) = 0x16bbc8;
    Hacl_HKDF_expand_sha2_256(o_ctx.ctx_nonce,prk,0x20,auStack_318 + lVar6,0x5e,0xc);
    *o_ctx.ctx_seq = 0;
  }
  return (uint)(bVar8 == 0xff);
}

Assistant:

uint32_t
Hacl_HPKE_Curve51_CP32_SHA256_setupBaseR(
  Hacl_Impl_HPKE_context_s o_ctx,
  uint8_t *enc,
  uint8_t *skR,
  uint32_t infolen,
  uint8_t *info
)
{
  uint8_t pkR[32U] = { 0U };
  Hacl_Curve25519_51_secret_to_public(pkR, skR);
  uint32_t res1 = 0U;
  uint8_t shared[32U] = { 0U };
  if (res1 == 0U)
  {
    uint8_t *pkE = enc;
    uint8_t dh[32U] = { 0U };
    uint8_t zeros[32U] = { 0U };
    Hacl_Curve25519_51_scalarmult(dh, skR, pkE);
    uint8_t res0 = 255U;
    for (uint32_t i = 0U; i < 32U; i++)
    {
      uint8_t uu____0 = FStar_UInt8_eq_mask(dh[i], zeros[i]);
      res0 = (uint32_t)uu____0 & (uint32_t)res0;
    }
    uint8_t z = res0;
    uint32_t res;
    if (z == 255U)
    {
      res = 1U;
    }
    else
    {
      res = 0U;
    }
    uint32_t res11 = res;
    uint32_t res2;
    uint8_t kemcontext[64U] = { 0U };
    if (res11 == 0U)
    {
      uint8_t *pkRm = kemcontext + 32U;
      uint8_t *pkR1 = pkRm;
      Hacl_Curve25519_51_secret_to_public(pkR1, skR);
      uint32_t res20 = 0U;
      if (res20 == 0U)
      {
        memcpy(kemcontext, enc, 32U * sizeof (uint8_t));
        uint8_t *dhm = dh;
        uint8_t o_eae_prk[32U] = { 0U };
        uint8_t suite_id_kem[5U] = { 0U };
        uint8_t *uu____1 = suite_id_kem;
        uu____1[0U] = 0x4bU;
        uu____1[1U] = 0x45U;
        uu____1[2U] = 0x4dU;
        uint8_t *uu____2 = suite_id_kem + 3U;
        uu____2[0U] = 0U;
        uu____2[1U] = 32U;
        uint8_t *empty = suite_id_kem;
        uint8_t label_eae_prk[7U] = { 0x65U, 0x61U, 0x65U, 0x5fU, 0x70U, 0x72U, 0x6bU };
        uint32_t len0 = 51U;
        KRML_CHECK_SIZE(sizeof (uint8_t), len0);
        uint8_t tmp0[len0];
        memset(tmp0, 0U, len0 * sizeof (uint8_t));
        uint8_t *uu____3 = tmp0;
        uu____3[0U] = 0x48U;
        uu____3[1U] = 0x50U;
        uu____3[2U] = 0x4bU;
        uu____3[3U] = 0x45U;
        uu____3[4U] = 0x2dU;
        uu____3[5U] = 0x76U;
        uu____3[6U] = 0x31U;
        memcpy(tmp0 + 7U, suite_id_kem, 5U * sizeof (uint8_t));
        memcpy(tmp0 + 12U, label_eae_prk, 7U * sizeof (uint8_t));
        memcpy(tmp0 + 19U, dhm, 32U * sizeof (uint8_t));
        Hacl_HKDF_extract_sha2_256(o_eae_prk, empty, 0U, tmp0, len0);
        uint8_t
        label_shared_secret[13U] =
          {
            0x73U, 0x68U, 0x61U, 0x72U, 0x65U, 0x64U, 0x5fU, 0x73U, 0x65U, 0x63U, 0x72U, 0x65U,
            0x74U
          };
        uint32_t len = 91U;
        KRML_CHECK_SIZE(sizeof (uint8_t), len);
        uint8_t tmp[len];
        memset(tmp, 0U, len * sizeof (uint8_t));
        store16_be(tmp, (uint16_t)32U);
        uint8_t *uu____4 = tmp + 2U;
        uu____4[0U] = 0x48U;
        uu____4[1U] = 0x50U;
        uu____4[2U] = 0x4bU;
        uu____4[3U] = 0x45U;
        uu____4[4U] = 0x2dU;
        uu____4[5U] = 0x76U;
        uu____4[6U] = 0x31U;
        memcpy(tmp + 9U, suite_id_kem, 5U * sizeof (uint8_t));
        memcpy(tmp + 14U, label_shared_secret, 13U * sizeof (uint8_t));
        memcpy(tmp + 27U, kemcontext, 64U * sizeof (uint8_t));
        Hacl_HKDF_expand_sha2_256(shared, o_eae_prk, 32U, tmp, len, 32U);
        res2 = 0U;
      }
      else
      {
        res2 = 1U;
      }
    }
    else
    {
      res2 = 1U;
    }
    if (res2 == 0U)
    {
      uint8_t o_context[65U] = { 0U };
      uint8_t o_secret[32U] = { 0U };
      uint8_t suite_id[10U] = { 0U };
      uint8_t *uu____5 = suite_id;
      uu____5[0U] = 0x48U;
      uu____5[1U] = 0x50U;
      uu____5[2U] = 0x4bU;
      uu____5[3U] = 0x45U;
      uint8_t *uu____6 = suite_id + 4U;
      uu____6[0U] = 0U;
      uu____6[1U] = 32U;
      uint8_t *uu____7 = suite_id + 6U;
      uu____7[0U] = 0U;
      uu____7[1U] = 1U;
      uint8_t *uu____8 = suite_id + 8U;
      uu____8[0U] = 0U;
      uu____8[1U] = 3U;
      uint8_t
      label_psk_id_hash[11U] =
        { 0x70U, 0x73U, 0x6bU, 0x5fU, 0x69U, 0x64U, 0x5fU, 0x68U, 0x61U, 0x73U, 0x68U };
      uint8_t o_psk_id_hash[32U] = { 0U };
      uint8_t *empty = suite_id;
      uint32_t len0 = 28U;
      KRML_CHECK_SIZE(sizeof (uint8_t), len0);
      uint8_t tmp0[len0];
      memset(tmp0, 0U, len0 * sizeof (uint8_t));
      uint8_t *uu____9 = tmp0;
      uu____9[0U] = 0x48U;
      uu____9[1U] = 0x50U;
      uu____9[2U] = 0x4bU;
      uu____9[3U] = 0x45U;
      uu____9[4U] = 0x2dU;
      uu____9[5U] = 0x76U;
      uu____9[6U] = 0x31U;
      memcpy(tmp0 + 7U, suite_id, 10U * sizeof (uint8_t));
      memcpy(tmp0 + 17U, label_psk_id_hash, 11U * sizeof (uint8_t));
      memcpy(tmp0 + 28U, empty, 0U * sizeof (uint8_t));
      Hacl_HKDF_extract_sha2_256(o_psk_id_hash, empty, 0U, tmp0, len0);
      uint8_t
      label_info_hash[9U] = { 0x69U, 0x6eU, 0x66U, 0x6fU, 0x5fU, 0x68U, 0x61U, 0x73U, 0x68U };
      uint8_t o_info_hash[32U] = { 0U };
      uint32_t len1 = 26U + infolen;
      KRML_CHECK_SIZE(sizeof (uint8_t), len1);
      uint8_t tmp1[len1];
      memset(tmp1, 0U, len1 * sizeof (uint8_t));
      uint8_t *uu____10 = tmp1;
      uu____10[0U] = 0x48U;
      uu____10[1U] = 0x50U;
      uu____10[2U] = 0x4bU;
      uu____10[3U] = 0x45U;
      uu____10[4U] = 0x2dU;
      uu____10[5U] = 0x76U;
      uu____10[6U] = 0x31U;
      memcpy(tmp1 + 7U, suite_id, 10U * sizeof (uint8_t));
      memcpy(tmp1 + 17U, label_info_hash, 9U * sizeof (uint8_t));
      memcpy(tmp1 + 26U, info, infolen * sizeof (uint8_t));
      Hacl_HKDF_extract_sha2_256(o_info_hash, empty, 0U, tmp1, len1);
      o_context[0U] = 0U;
      memcpy(o_context + 1U, o_psk_id_hash, 32U * sizeof (uint8_t));
      memcpy(o_context + 33U, o_info_hash, 32U * sizeof (uint8_t));
      uint8_t label_secret[6U] = { 0x73U, 0x65U, 0x63U, 0x72U, 0x65U, 0x74U };
      uint32_t len2 = 23U;
      KRML_CHECK_SIZE(sizeof (uint8_t), len2);
      uint8_t tmp2[len2];
      memset(tmp2, 0U, len2 * sizeof (uint8_t));
      uint8_t *uu____11 = tmp2;
      uu____11[0U] = 0x48U;
      uu____11[1U] = 0x50U;
      uu____11[2U] = 0x4bU;
      uu____11[3U] = 0x45U;
      uu____11[4U] = 0x2dU;
      uu____11[5U] = 0x76U;
      uu____11[6U] = 0x31U;
      memcpy(tmp2 + 7U, suite_id, 10U * sizeof (uint8_t));
      memcpy(tmp2 + 17U, label_secret, 6U * sizeof (uint8_t));
      memcpy(tmp2 + 23U, empty, 0U * sizeof (uint8_t));
      Hacl_HKDF_extract_sha2_256(o_secret, shared, 32U, tmp2, len2);
      uint8_t label_exp[3U] = { 0x65U, 0x78U, 0x70U };
      uint32_t len3 = 87U;
      KRML_CHECK_SIZE(sizeof (uint8_t), len3);
      uint8_t tmp3[len3];
      memset(tmp3, 0U, len3 * sizeof (uint8_t));
      store16_be(tmp3, (uint16_t)32U);
      uint8_t *uu____12 = tmp3 + 2U;
      uu____12[0U] = 0x48U;
      uu____12[1U] = 0x50U;
      uu____12[2U] = 0x4bU;
      uu____12[3U] = 0x45U;
      uu____12[4U] = 0x2dU;
      uu____12[5U] = 0x76U;
      uu____12[6U] = 0x31U;
      memcpy(tmp3 + 9U, suite_id, 10U * sizeof (uint8_t));
      memcpy(tmp3 + 19U, label_exp, 3U * sizeof (uint8_t));
      memcpy(tmp3 + 22U, o_context, 65U * sizeof (uint8_t));
      Hacl_HKDF_expand_sha2_256(o_ctx.ctx_exporter, o_secret, 32U, tmp3, len3, 32U);
      uint8_t label_key[3U] = { 0x6bU, 0x65U, 0x79U };
      uint32_t len4 = 87U;
      KRML_CHECK_SIZE(sizeof (uint8_t), len4);
      uint8_t tmp4[len4];
      memset(tmp4, 0U, len4 * sizeof (uint8_t));
      store16_be(tmp4, (uint16_t)32U);
      uint8_t *uu____13 = tmp4 + 2U;
      uu____13[0U] = 0x48U;
      uu____13[1U] = 0x50U;
      uu____13[2U] = 0x4bU;
      uu____13[3U] = 0x45U;
      uu____13[4U] = 0x2dU;
      uu____13[5U] = 0x76U;
      uu____13[6U] = 0x31U;
      memcpy(tmp4 + 9U, suite_id, 10U * sizeof (uint8_t));
      memcpy(tmp4 + 19U, label_key, 3U * sizeof (uint8_t));
      memcpy(tmp4 + 22U, o_context, 65U * sizeof (uint8_t));
      Hacl_HKDF_expand_sha2_256(o_ctx.ctx_key, o_secret, 32U, tmp4, len4, 32U);
      uint8_t
      label_base_nonce[10U] =
        { 0x62U, 0x61U, 0x73U, 0x65U, 0x5fU, 0x6eU, 0x6fU, 0x6eU, 0x63U, 0x65U };
      uint32_t len = 94U;
      KRML_CHECK_SIZE(sizeof (uint8_t), len);
      uint8_t tmp[len];
      memset(tmp, 0U, len * sizeof (uint8_t));
      store16_be(tmp, (uint16_t)12U);
      uint8_t *uu____14 = tmp + 2U;
      uu____14[0U] = 0x48U;
      uu____14[1U] = 0x50U;
      uu____14[2U] = 0x4bU;
      uu____14[3U] = 0x45U;
      uu____14[4U] = 0x2dU;
      uu____14[5U] = 0x76U;
      uu____14[6U] = 0x31U;
      memcpy(tmp + 9U, suite_id, 10U * sizeof (uint8_t));
      memcpy(tmp + 19U, label_base_nonce, 10U * sizeof (uint8_t));
      memcpy(tmp + 29U, o_context, 65U * sizeof (uint8_t));
      Hacl_HKDF_expand_sha2_256(o_ctx.ctx_nonce, o_secret, 32U, tmp, len, 12U);
      o_ctx.ctx_seq[0U] = 0ULL;
      return 0U;
    }
    return 1U;
  }
  return 1U;
}